

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniz.c
# Opt level: O2

int mz_uncompress2(uchar *pDest,mz_ulong *pDest_len,uchar *pSource,mz_ulong *pSource_len)

{
  int iVar1;
  int iVar2;
  mz_stream local_90;
  
  local_90.data_type = 0;
  local_90._92_4_ = 0;
  local_90.adler = 0;
  local_90.zfree = (mz_free_func)0x0;
  local_90.opaque = (void *)0x0;
  local_90.state = (mz_internal_state *)0x0;
  local_90.zalloc = (mz_alloc_func)0x0;
  local_90.total_out = 0;
  local_90.msg = (char *)0x0;
  local_90.reserved = 0;
  local_90.total_in = 0;
  iVar1 = -10000;
  if ((*pDest_len | *pSource_len) >> 0x20 == 0) {
    local_90._8_8_ = *pSource_len & 0xffffffff;
    local_90._32_8_ = *pDest_len & 0xffffffff;
    local_90.next_in = pSource;
    local_90.next_out = pDest;
    iVar1 = mz_inflateInit(&local_90);
    if (iVar1 == 0) {
      iVar2 = mz_inflate(&local_90,4);
      *pSource_len = *pSource_len - (local_90._8_8_ & 0xffffffff);
      if (iVar2 == 1) {
        *pDest_len = local_90.total_out;
        iVar1 = 0;
        if (local_90.state != (mz_internal_state *)0x0) {
          (*local_90.zfree)(local_90.opaque,local_90.state);
        }
      }
      else {
        if (local_90.state != (mz_internal_state *)0x0) {
          (*local_90.zfree)(local_90.opaque,local_90.state);
        }
        iVar1 = -3;
        if (iVar2 != -5 || local_90.avail_in != 0) {
          iVar1 = iVar2;
        }
      }
    }
  }
  return iVar1;
}

Assistant:

int mz_uncompress2(unsigned char *pDest, mz_ulong *pDest_len, const unsigned char *pSource, mz_ulong *pSource_len)
{
    mz_stream stream;
    int status;
    memset(&stream, 0, sizeof(stream));

    /* In case mz_ulong is 64-bits (argh I hate longs). */
    if ((*pSource_len | *pDest_len) > 0xFFFFFFFFU)
        return MZ_PARAM_ERROR;

    stream.next_in = pSource;
    stream.avail_in = (mz_uint32)*pSource_len;
    stream.next_out = pDest;
    stream.avail_out = (mz_uint32)*pDest_len;

    status = mz_inflateInit(&stream);
    if (status != MZ_OK)
        return status;

    status = mz_inflate(&stream, MZ_FINISH);
    *pSource_len = *pSource_len - stream.avail_in;
    if (status != MZ_STREAM_END)
    {
        mz_inflateEnd(&stream);
        return ((status == MZ_BUF_ERROR) && (!stream.avail_in)) ? MZ_DATA_ERROR : status;
    }
    *pDest_len = stream.total_out;

    return mz_inflateEnd(&stream);
}